

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void av1_fwd_txfm2d_64x64_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i_1;
  int i;
  int c;
  int r;
  int width_div8;
  int width_div16;
  transform_1d_avx2_conflict2 row_txfm;
  transform_1d_avx2_conflict2 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m256i buf1 [512];
  __m256i buf0 [512];
  TX_SIZE tx_size;
  int in_stack_ffffffffffff7f40;
  int in_stack_ffffffffffff7f44;
  int in_stack_ffffffffffff7f48;
  undefined4 in_stack_ffffffffffff7f4c;
  __m256i *in_stack_ffffffffffff7f50;
  int local_80a8;
  int local_80a4;
  int local_80a0;
  int local_809c;
  undefined8 uVar4;
  int size;
  int in_stack_ffffffffffff8080;
  int in_stack_ffffffffffff8084;
  __m256i *in_stack_ffffffffffff8088;
  __m256i *in_stack_ffffffffffff8090;
  int in_stack_ffffffffffff8768;
  int in_stack_ffffffffffff876c;
  int in_stack_ffffffffffff8770;
  int in_stack_ffffffffffff8774;
  __m256i *in_stack_ffffffffffff8778;
  int16_t *in_stack_ffffffffffff8780;
  int in_stack_ffffffffffff91bc;
  int in_stack_ffffffffffff91c0;
  int8_t in_stack_ffffffffffff91c7;
  __m256i *in_stack_ffffffffffff91c8;
  __m256i *in_stack_ffffffffffff91d0;
  
  iVar1 = get_txw_idx('\x04');
  iVar2 = get_txh_idx('\x04');
  iVar3 = (int)av1_fwd_cos_bit_col[iVar1][iVar2];
  iVar1 = (int)av1_fwd_cos_bit_row[iVar1][iVar2];
  size = 0x40;
  iVar2 = 0x40;
  uVar4 = 0;
  for (local_80a4 = 0; local_80a4 < 4; local_80a4 = local_80a4 + 1) {
    in_stack_ffffffffffff7f40 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffff8780,in_stack_ffffffffffff8778,in_stack_ffffffffffff8774,
               in_stack_ffffffffffff8770,in_stack_ffffffffffff876c,in_stack_ffffffffffff8768,
               in_stack_ffffffffffff7f48);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2,(int)((ulong)uVar4 >> 0x20))
    ;
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2,(int)((ulong)uVar4 >> 0x20))
    ;
    fdct64_avx2(in_stack_ffffffffffff91d0,in_stack_ffffffffffff91c8,in_stack_ffffffffffff91c7,
                in_stack_ffffffffffff91c0,in_stack_ffffffffffff91bc);
    fdct64_avx2(in_stack_ffffffffffff91d0,in_stack_ffffffffffff91c8,in_stack_ffffffffffff91c7,
                in_stack_ffffffffffff91c0,in_stack_ffffffffffff91bc);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2,(int)((ulong)uVar4 >> 0x20))
    ;
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2,(int)((ulong)uVar4 >> 0x20))
    ;
  }
  for (local_809c = 0; local_809c < 0x40; local_809c = local_809c + 8) {
    for (local_80a0 = 0; local_80a0 < 8; local_80a0 = local_80a0 + 1) {
      fwd_txfm_transpose_8x8_avx2
                (in_stack_ffffffffffff8090,in_stack_ffffffffffff8088,in_stack_ffffffffffff8084,
                 in_stack_ffffffffffff8080);
    }
  }
  for (local_80a8 = 0; local_80a8 < 2; local_80a8 = local_80a8 + 1) {
    fdct64_avx2(in_stack_ffffffffffff91d0,in_stack_ffffffffffff91c8,in_stack_ffffffffffff91c7,
                in_stack_ffffffffffff91c0,in_stack_ffffffffffff91bc);
    fdct64_avx2(in_stack_ffffffffffff91d0,in_stack_ffffffffffff91c8,in_stack_ffffffffffff91c7,
                in_stack_ffffffffffff91c0,in_stack_ffffffffffff91bc);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2,(int)((ulong)uVar4 >> 0x20))
    ;
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2,(int)((ulong)uVar4 >> 0x20))
    ;
  }
  store_buffer_avx2(in_stack_ffffffffffff7f50,
                    (int32_t *)CONCAT44(in_stack_ffffffffffff7f4c,in_stack_ffffffffffff7f48),
                    in_stack_ffffffffffff7f44,in_stack_ffffffffffff7f40);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x64_avx2(const int16_t *input, int32_t *output,
                               int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X64;
  __m256i buf0[512], buf1[512];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct64_avx2;
  const transform_1d_avx2 row_txfm = fdct64_avx2;
  const int width_div16 = (width >> 4);
  const int width_div8 = (width >> 3);
  int r, c;
  for (int i = 0; i < width_div16; i++) {
    load_buffer_16xn_avx2(input + (i << 4), &buf0[i << 1], stride, height,
                          width_div8, 0, 0);
    round_shift_32_8xn_avx2(&buf0[i << 1], height, shift[0], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[0], width_div8);
    col_txfm(&buf0[i << 1], &buf0[i << 1], cos_bit_col, width_div8, width_div8);
    col_txfm(&buf0[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_col, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf0[i << 1], height, shift[1], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[1], width_div8);
  }

  for (r = 0; r < height; r += 8) {
    for (c = 0; c < width_div8; c++) {
      fwd_txfm_transpose_8x8_avx2(&buf0[r * width_div8 + c],
                                  &buf1[c * 8 * width_div8 + (r >> 3)],
                                  width_div8, width_div8);
    }
  }

  for (int i = 0; i < 2; i++) {
    row_txfm(&buf1[i << 1], &buf0[i << 1], cos_bit_row, width_div8,
             width_div16);
    row_txfm(&buf1[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_row, width_div8,
             width_div16);
    round_shift_32_8xn_avx2(&buf0[i << 1], (height >> 1), shift[2],
                            width_div16);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], (height >> 1), shift[2],
                            width_div16);
  }

  store_buffer_avx2(buf0, output, 8, 128);
}